

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O1

void nni_epoll_thr(void *arg)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  int *piVar5;
  ssize_t sVar6;
  void *item;
  nni_posix_pfd *pfd;
  long lVar7;
  undefined1 local_358 [8];
  epoll_event events [64];
  undefined1 local_50 [8];
  uint64_t clear;
  ulong local_40;
  nni_mtx *local_38;
  
  clear = (long)arg + 0x28;
  local_38 = (nni_mtx *)arg;
  do {
    do {
      do {
        uVar4 = epoll_wait(local_38[2].mtx.__data.__kind,(epoll_event *)local_358,0x40,-1);
        if (((int)uVar4 < 0) && (piVar5 = __errno_location(), *piVar5 == 9)) {
          return;
        }
      } while ((int)uVar4 < 1);
      lVar7 = 0;
      local_40 = 0;
      do {
        lVar3 = *(long *)(local_358 + lVar7 + 4);
        if ((lVar3 == 0) && ((local_358[lVar7] & 1) != 0)) {
          sVar6 = read(*(int *)((long)&local_38[2].mtx + 0x14),local_50,8);
          local_40 = CONCAT71((int7)((ulong)sVar6 >> 8),1);
        }
        else {
          uVar2 = *(uint *)(local_358 + lVar7);
          nni_atomic_and((nni_atomic_int *)(lVar3 + 0x30),~(uVar2 & 0x1d));
          (**(code **)(lVar3 + 0x20))(*(undefined8 *)(lVar3 + 0x28),uVar2 & 0x1d);
        }
        lVar7 = lVar7 + 0xc;
      } while ((ulong)uVar4 * 0xc != lVar7);
    } while ((local_40 & 1) == 0);
    nni_mtx_lock(local_38);
    while (item = nni_list_first((nni_list *)((long)arg + 0x108)), item != (void *)0x0) {
      nni_list_remove((nni_list *)((long)arg + 0x108),item);
    }
    nni_cv_wake((nni_cv *)clear);
    cVar1 = local_38[2].mtx.__size[0x18];
    nni_mtx_unlock(local_38);
  } while (cVar1 != '\x01');
  return;
}

Assistant:

static void
nni_epoll_thr(void *arg)
{
	nni_posix_pollq   *pq = arg;
	struct epoll_event events[NNI_MAX_EPOLL_EVENTS];

	for (;;) {
		int  n;
		bool reap = false;

		n = epoll_wait(pq->epfd, events, NNI_MAX_EPOLL_EVENTS, -1);
		if ((n < 0) && (errno == EBADF)) {
			// Epoll fd closed, bail.
			return;
		}

		// dispatch events
		for (int i = 0; i < n; ++i) {
			const struct epoll_event *ev;

			ev = &events[i];
			// If the waker pipe was signaled, read from it.
			if ((ev->data.ptr == NULL) &&
			    (ev->events & (unsigned) POLLIN)) {
				uint64_t clear;
				(void) read(pq->evfd, &clear, sizeof(clear));
				reap = true;
			} else {
				nni_posix_pfd *pfd = ev->data.ptr;
				unsigned       mask;

				mask = ev->events &
				    ((unsigned) (EPOLLIN | EPOLLOUT |
				        EPOLLERR | EPOLLHUP));

				nni_atomic_and(&pfd->events, (int) ~mask);

				// Execute the callback with lock released
				pfd->cb(pfd->arg, mask);
			}
		}

		if (reap) {
			nni_mtx_lock(&pq->mtx);
			nni_posix_pollq_reap(pq);
			if (pq->close) {
				nni_mtx_unlock(&pq->mtx);
				return;
			}
			nni_mtx_unlock(&pq->mtx);
		}
	}
}